

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_enc.cc
# Opt level: O2

bool __thiscall
bssl::tls13_set_traffic_key
          (bssl *this,SSL *ssl,ssl_encryption_level_t level,evp_aead_direction_t direction,
          SSL_SESSION *session,Span<const_unsigned_char> traffic_secret)

{
  pointer __p;
  string_view label;
  string_view label_00;
  Span<const_unsigned_char> fixed_iv;
  char cVar1;
  bool bVar2;
  uint16_t version;
  int iVar3;
  int iVar4;
  EVP_MD *digest;
  size_t sVar5;
  undefined4 in_register_0000000c;
  SSL_SESSION *session_00;
  Span<unsigned_char> *this_00;
  long lVar6;
  size_t in_R9;
  Span<const_unsigned_char> secret;
  Span<const_unsigned_char> secret_00;
  Span<const_unsigned_char> enc_key;
  Span<const_unsigned_char> in;
  Span<unsigned_char> SVar7;
  Span<unsigned_char> SVar8;
  Span<unsigned_char> out;
  UniquePtr<SSLAEADContext> traffic_aead;
  EVP_AEAD *aead;
  size_t discard;
  uint8_t key_buf [80];
  uint8_t iv_buf [32];
  SSL_CIPHER *in_stack_fffffffffffffe68;
  _Head_base<0UL,_bssl::SSLAEADContext_*,_false> local_170;
  size_t local_168;
  undefined4 local_160;
  ssl_encryption_level_t local_15c;
  Span<unsigned_char> local_158;
  size_t local_148;
  uchar *local_140;
  size_t local_138;
  unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> local_130;
  unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> local_128;
  EVP_AEAD *local_120;
  uchar *local_118;
  size_t sStack_110;
  undefined8 local_108;
  char *pcStack_100;
  undefined8 local_f8;
  char *pcStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  size_t local_b0;
  Span<unsigned_char> local_a8 [5];
  uchar local_58 [40];
  
  session_00 = (SSL_SESSION *)CONCAT44(in_register_0000000c,direction);
  local_160 = SUB84(ssl,0);
  local_168 = in_R9;
  local_15c = level;
  version = ssl_session_protocol_version(session_00);
  digest = ssl_session_get_digest(session_00);
  iVar3 = SSL_is_dtls((SSL *)this);
  local_170._M_head_impl = (SSLAEADContext *)0x0;
  iVar4 = SSL_is_quic((SSL *)this);
  if (iVar4 == 0) {
    bVar2 = ssl_cipher_get_evp_aead(&local_120,&local_b0,&local_b0,session_00->cipher,version);
    if (bVar2) {
      local_158.data_ = (uchar *)local_a8;
      local_158.size_ = 0x50;
      sVar5 = EVP_AEAD_key_length(local_120);
      SVar7 = Span<unsigned_char>::first(&local_158,sVar5);
      local_138 = SVar7.size_;
      local_158.data_ = local_58;
      local_158.size_ = 0x20;
      sVar5 = EVP_AEAD_nonce_length(local_120);
      SVar8 = Span<unsigned_char>::first(&local_158,sVar5);
      local_148 = SVar8.size_;
      local_140 = SVar8.data_;
      local_f8 = 3;
      pcStack_f0 = "key";
      local_c8 = 0;
      uStack_c0 = 0;
      label._M_str = "key";
      label._M_len = 3;
      secret.size_ = local_168;
      secret.data_ = (uchar *)session;
      SVar8.size_ = local_138;
      SVar8.data_ = SVar7.data_;
      bVar2 = hkdf_expand_label(SVar8,digest,secret,label,(Span<const_unsigned_char>)ZEXT816(0),
                                iVar3 != 0);
      if (bVar2) {
        local_108 = 2;
        pcStack_100 = "iv";
        local_d8 = 0;
        uStack_d0 = 0;
        label_00._M_str = "iv";
        label_00._M_len = 2;
        secret_00.size_ = local_168;
        secret_00.data_ = (uchar *)session;
        out.size_ = local_148;
        out.data_ = local_140;
        bVar2 = hkdf_expand_label(out,digest,secret_00,label_00,
                                  (Span<const_unsigned_char>)ZEXT816(0),iVar3 != 0);
        if (bVar2) {
          local_e8 = 0;
          uStack_e0 = 0;
          local_118 = local_140;
          sStack_110 = local_148;
          fixed_iv.size_ = local_148;
          fixed_iv.data_ = local_140;
          enc_key.size_ = (size_t)SVar7.data_;
          enc_key.data_ = (uchar *)session_00->cipher;
          SSLAEADContext::Create
                    ((evp_aead_direction_t)&local_158,(uint16_t)local_15c,
                     (SSL_CIPHER *)(ulong)session_00->ssl_version,enc_key,
                     (Span<const_unsigned_char>)ZEXT816(0),fixed_iv);
          this_00 = &local_158;
          goto LAB_00162116;
        }
      }
    }
  }
  else {
    SSLAEADContext::CreatePlaceholderForQUIC(in_stack_fffffffffffffe68);
    this_00 = local_a8;
LAB_00162116:
    __p = (((__uniq_ptr_data<bssl::SSLAEADContext,_bssl::internal::Deleter,_true,_true> *)
           &this_00->data_)->super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>).
          _M_t.super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl;
    (((__uniq_ptr_data<bssl::SSLAEADContext,_bssl::internal::Deleter,_true,_true> *)&this_00->data_)
    ->super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>)._M_t.
    super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl = (SSLAEADContext *)0x0;
    std::__uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>::reset
              ((__uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter> *)&local_170,__p);
    std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> *)this_00);
    if (local_170._M_head_impl != (SSLAEADContext *)0x0) {
      if (local_15c == ssl_encryption_initial) {
        local_128._M_t.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl =
             (__uniq_ptr_data<bssl::SSLAEADContext,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_data<bssl::SSLAEADContext,_bssl::internal::Deleter,_true,_true>)
             local_170._M_head_impl;
        local_170._M_head_impl = (SSLAEADContext *)0x0;
        cVar1 = (**(code **)(*(long *)this + 0x98))(this,local_160,&local_128,session,local_168);
        std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::~unique_ptr(&local_128);
        lVar6 = 0x161;
      }
      else {
        local_130._M_t.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl =
             (__uniq_ptr_data<bssl::SSLAEADContext,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_data<bssl::SSLAEADContext,_bssl::internal::Deleter,_true,_true>)
             local_170._M_head_impl;
        local_170._M_head_impl = (SSLAEADContext *)0x0;
        cVar1 = (**(code **)(*(long *)this + 0xa0))(this,local_160,&local_130,session,local_168);
        std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::~unique_ptr(&local_130);
        lVar6 = 0x120;
      }
      if (cVar1 != '\0') {
        bVar2 = true;
        in.size_ = local_168;
        in.data_ = (uchar *)session;
        InplaceVector<unsigned_char,_64UL>::CopyFrom
                  ((InplaceVector<unsigned_char,_64UL> *)(lVar6 + *(long *)(this + 0x30)),in);
        goto LAB_001623ae;
      }
    }
  }
  bVar2 = false;
LAB_001623ae:
  std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> *)&local_170);
  return bVar2;
}

Assistant:

bool tls13_set_traffic_key(SSL *ssl, enum ssl_encryption_level_t level,
                           enum evp_aead_direction_t direction,
                           const SSL_SESSION *session,
                           Span<const uint8_t> traffic_secret) {
  uint16_t version = ssl_session_protocol_version(session);
  const EVP_MD *digest = ssl_session_get_digest(session);
  bool is_dtls = SSL_is_dtls(ssl);
  UniquePtr<SSLAEADContext> traffic_aead;
  if (SSL_is_quic(ssl)) {
    // Install a placeholder SSLAEADContext so that SSL accessors work. The
    // encryption itself will be handled by the SSL_QUIC_METHOD.
    traffic_aead = SSLAEADContext::CreatePlaceholderForQUIC(session->cipher);
  } else {
    // Look up cipher suite properties.
    const EVP_AEAD *aead;
    size_t discard;
    if (!ssl_cipher_get_evp_aead(&aead, &discard, &discard, session->cipher,
                                 version)) {
      return false;
    }

    // Derive the key and IV.
    uint8_t key_buf[EVP_AEAD_MAX_KEY_LENGTH], iv_buf[EVP_AEAD_MAX_NONCE_LENGTH];
    auto key = Span(key_buf).first(EVP_AEAD_key_length(aead));
    auto iv = Span(iv_buf).first(EVP_AEAD_nonce_length(aead));
    if (!hkdf_expand_label(key, digest, traffic_secret, "key", {}, is_dtls) ||
        !hkdf_expand_label(iv, digest, traffic_secret, "iv", {}, is_dtls)) {
      return false;
    }

    traffic_aead = SSLAEADContext::Create(direction, session->ssl_version,
                                          session->cipher, key, {}, iv);
  }

  if (!traffic_aead) {
    return false;
  }

  if (direction == evp_aead_open) {
    if (!ssl->method->set_read_state(ssl, level, std::move(traffic_aead),
                                     traffic_secret)) {
      return false;
    }
    ssl->s3->read_traffic_secret.CopyFrom(traffic_secret);
  } else {
    if (!ssl->method->set_write_state(ssl, level, std::move(traffic_aead),
                                      traffic_secret)) {
      return false;
    }
    ssl->s3->write_traffic_secret.CopyFrom(traffic_secret);
  }

  return true;
}